

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldValue
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  TokenType TVar1;
  size_t __n;
  bool bVar2;
  Type TVar3;
  int iVar4;
  LogMessage *other;
  EnumValueDescriptor *pEVar5;
  long *plVar6;
  _func_int **pp_Var7;
  byte bVar8;
  ulong uVar9;
  size_type *psVar10;
  long lVar11;
  long i;
  bool bVar12;
  long lVar13;
  float fVar14;
  int64 value;
  int64 int_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 local_d0 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  EnumDescriptor *local_38;
  
  TVar3 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4)) {
  case 1:
    bVar2 = ConsumeSignedInteger(this,(int64 *)local_d0,0x7fffffff);
    if (!bVar2) {
      return false;
    }
    bVar2 = *(int *)(field + 0x4c) == 3;
    uVar9 = local_d0._0_8_ & 0xffffffff;
    pp_Var7 = reflection->_vptr_Reflection;
    lVar11 = 0x208;
    lVar13 = 0xe8;
    goto LAB_005de77d;
  case 2:
    bVar2 = ConsumeSignedInteger(this,(int64 *)local_d0,0x7fffffffffffffff);
    if (!bVar2) {
      return false;
    }
    iVar4 = *(int *)(field + 0x4c);
    pp_Var7 = reflection->_vptr_Reflection;
    lVar11 = 0x210;
    lVar13 = 0xf0;
    goto LAB_005de6d9;
  case 3:
    bVar2 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,0xffffffff);
    if (!bVar2) {
      return false;
    }
    bVar2 = *(int *)(field + 0x4c) == 3;
    uVar9 = local_d0._0_8_ & 0xffffffff;
    pp_Var7 = reflection->_vptr_Reflection;
    lVar11 = 0x218;
    lVar13 = 0xf8;
    goto LAB_005de77d;
  case 4:
    bVar2 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,0xffffffffffffffff);
    if (!bVar2) {
      return false;
    }
    iVar4 = *(int *)(field + 0x4c);
    pp_Var7 = reflection->_vptr_Reflection;
    lVar11 = 0x220;
    lVar13 = 0x100;
LAB_005de6d9:
    if (iVar4 == 3) {
      lVar13 = lVar11;
    }
    (**(code **)((long)pp_Var7 + lVar13))(reflection,message,field,local_d0._0_8_);
    break;
  case 5:
    bVar2 = ConsumeDouble(this,(double *)local_d0);
    if (!bVar2) {
      return false;
    }
    iVar4 = *(int *)(field + 0x4c);
    fVar14 = (float)local_d0._0_8_;
    pp_Var7 = reflection->_vptr_Reflection;
    lVar11 = 0x230;
    lVar13 = 0x110;
    goto LAB_005de724;
  case 6:
    bVar2 = ConsumeDouble(this,(double *)local_d0);
    if (!bVar2) {
      return false;
    }
    iVar4 = *(int *)(field + 0x4c);
    fVar14 = io::SafeDoubleToFloat((double)local_d0._0_8_);
    pp_Var7 = reflection->_vptr_Reflection;
    lVar11 = 0x228;
    lVar13 = 0x108;
LAB_005de724:
    if (iVar4 == 3) {
      lVar13 = lVar11;
    }
    (**(code **)((long)pp_Var7 + lVar13))(fVar14,reflection,message,field);
    break;
  case 7:
    if ((this->tokenizer_).current_.type != TYPE_INTEGER) {
      local_d0._8_8_ = (char *)0x0;
      local_d0[0x10] = '\0';
      local_d0._0_8_ = local_d0 + 0x10;
      bVar2 = ConsumeIdentifier(this,(string *)local_d0);
      if (bVar2) {
        iVar4 = std::__cxx11::string::compare(local_d0);
        if (((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare(local_d0), iVar4 == 0)) ||
           (iVar4 = std::__cxx11::string::compare(local_d0), iVar4 == 0)) {
          if (*(int *)(field + 0x4c) == 3) {
            pp_Var7 = reflection->_vptr_Reflection + 0x47;
          }
          else {
            pp_Var7 = reflection->_vptr_Reflection + 0x23;
          }
          bVar8 = 1;
        }
        else {
          iVar4 = std::__cxx11::string::compare(local_d0);
          if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare(local_d0), iVar4 != 0)) &&
             (iVar4 = std::__cxx11::string::compare(local_d0), iVar4 != 0)) {
            std::operator+(&local_58,"Invalid value for boolean field \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            field);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
            psVar10 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_98.field_2._M_allocated_capacity = *psVar10;
              local_98.field_2._8_8_ = plVar6[3];
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            }
            else {
              local_98.field_2._M_allocated_capacity = *psVar10;
              local_98._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_98._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::operator+(&local_78,&local_98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_d0);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
            psVar10 = (size_type *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_f0.field_2._M_allocated_capacity = *psVar10;
              local_f0.field_2._8_8_ = plVar6[3];
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            }
            else {
              local_f0.field_2._M_allocated_capacity = *psVar10;
              local_f0._M_dataplus._M_p = (pointer)*plVar6;
            }
            local_f0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar10;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        &local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
                &local_78.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                       (int)local_78._M_dataplus._M_p),
                              local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            goto LAB_005def41;
          }
          if (*(int *)(field + 0x4c) == 3) {
            pp_Var7 = reflection->_vptr_Reflection + 0x47;
          }
          else {
            pp_Var7 = reflection->_vptr_Reflection + 0x23;
          }
          bVar8 = 0;
        }
        bVar2 = true;
        (**pp_Var7)(reflection,message,field,(ulong)bVar8);
      }
      else {
LAB_005def41:
        bVar2 = false;
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
      }
      goto joined_r0x005de7ff;
    }
    bVar2 = ConsumeUnsignedInteger(this,(uint64 *)local_d0,1);
    if (!bVar2) {
      return false;
    }
    uVar9 = (ulong)((pointer)local_d0._0_8_ != (pointer)0x0);
    bVar2 = *(int *)(field + 0x4c) == 3;
    pp_Var7 = reflection->_vptr_Reflection;
    lVar11 = 0x238;
    lVar13 = 0x118;
LAB_005de77d:
    if (bVar2) {
      lVar13 = lVar11;
    }
    (**(code **)((long)pp_Var7 + lVar13))(reflection,message,field,uVar9);
    break;
  case 8:
    local_d0._0_8_ = local_d0 + 0x10;
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    local_38 = FieldDescriptor::enum_type(field);
    if ((this->tokenizer_).current_.type == TYPE_IDENTIFIER) {
      bVar2 = ConsumeIdentifier(this,(string *)local_d0);
      if (!bVar2) goto LAB_005dedf5;
      pEVar5 = EnumDescriptor::FindValueByName(local_38,(string *)local_d0);
LAB_005dea90:
      if (pEVar5 != (EnumValueDescriptor *)0x0) {
        lVar13 = 0x128;
        if (*(int *)(field + 0x4c) == 3) {
          lVar13 = 0x248;
        }
        (**(code **)((long)reflection->_vptr_Reflection + lVar13))(reflection,message,field,pEVar5);
        bVar2 = false;
        goto LAB_005dedf8;
      }
      if (this->allow_unknown_enum_ == false) {
        std::operator+(&local_58,"Unknown enumeration value of \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                      );
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_98.field_2._M_allocated_capacity = *psVar10;
          local_98.field_2._8_8_ = plVar6[3];
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar10;
          local_98._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_98._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::operator+(&local_78,&local_98,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field)
        ;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
        psVar10 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_f0.field_2._M_allocated_capacity = *psVar10;
          local_f0.field_2._8_8_ = plVar6[3];
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        }
        else {
          local_f0.field_2._M_allocated_capacity = *psVar10;
          local_f0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_f0._M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),
                          local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) goto LAB_005deded;
        goto LAB_005dedf5;
      }
      std::operator+(&local_58,"Unknown enumeration value of \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_98.field_2._M_allocated_capacity = *psVar10;
        local_98.field_2._8_8_ = plVar6[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar10;
        local_98._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_98._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::operator+(&local_78,&local_98,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)field);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_78);
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_f0.field_2._M_allocated_capacity = *psVar10;
        local_f0.field_2._8_8_ = plVar6[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar10;
        local_f0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_f0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      bVar2 = true;
      bVar12 = true;
    }
    else {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"-","");
      __n = (this->tokenizer_).current_.text._M_string_length;
      if ((__n == local_f0._M_string_length) &&
         ((__n == 0 ||
          (iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_f0._M_dataplus._M_p,
                        __n), iVar4 == 0)))) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
LAB_005dea10:
        bVar2 = ConsumeSignedInteger(this,(int64 *)&local_78,0x7fffffff);
        if (bVar2) {
          SimpleItoa_abi_cxx11_
                    (&local_f0,
                     (protobuf *)
                     CONCAT44(local_78._M_dataplus._M_p._4_4_,(int)local_78._M_dataplus._M_p),i);
          std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          pEVar5 = EnumDescriptor::FindValueByNumber(local_38,(int)local_78._M_dataplus._M_p);
        }
        else {
          pEVar5 = (EnumValueDescriptor *)0x0;
        }
        if (bVar2) goto LAB_005dea90;
      }
      else {
        TVar1 = (this->tokenizer_).current_.type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (TVar1 == TYPE_INTEGER) goto LAB_005dea10;
        std::operator+(&local_f0,"Expected integer or identifier, got: ",
                       &(this->tokenizer_).current_.text);
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    &local_f0);
        local_58.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
        local_58._M_dataplus._M_p = local_f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_005dedf5;
LAB_005deded:
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
LAB_005dedf5:
      bVar2 = true;
LAB_005dedf8:
      bVar12 = false;
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
    if (bVar2) {
      return bVar12;
    }
    break;
  case 9:
    local_d0._8_8_ = (char *)0x0;
    local_d0[0x10] = '\0';
    local_d0._0_8_ = local_d0 + 0x10;
    bVar2 = ConsumeString(this,(string *)local_d0);
    if (bVar2) {
      lVar13 = 0x120;
      if (*(int *)(field + 0x4c) == 3) {
        lVar13 = 0x240;
      }
      (**(code **)((long)reflection->_vptr_Reflection + lVar13))(reflection,message,field,local_d0);
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,CONCAT71(local_d0._17_7_,local_d0[0x10]) + 1);
    }
joined_r0x005de7ff:
    if (!bVar2) {
      return false;
    }
    break;
  case 10:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x2f4);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_d0,"Reached an unintended state: CPPTYPE_MESSAGE");
    internal::LogFinisher::operator=((LogFinisher *)&local_f0,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_d0);
  }
  return true;
}

Assistant:

bool ConsumeFieldValue(Message* message,
                         const Reflection* reflection,
                         const FieldDescriptor* field) {

// Define an easy to use macro for setting fields. This macro checks
// to see if the field is repeated (in which case we need to use the Add
// methods or not (in which case we need to use the Set methods).
#define SET_FIELD(CPPTYPE, VALUE)                                  \
        if (field->is_repeated()) {                                \
          reflection->Add##CPPTYPE(message, field, VALUE);         \
        } else {                                                   \
          reflection->Set##CPPTYPE(message, field, VALUE);         \
        }                                                          \

    switch(field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_INT32: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint32max));
        SET_FIELD(Int32, static_cast<int32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT32: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint32max));
        SET_FIELD(UInt32, static_cast<uint32>(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_INT64: {
        int64 value;
        DO(ConsumeSignedInteger(&value, kint64max));
        SET_FIELD(Int64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_UINT64: {
        uint64 value;
        DO(ConsumeUnsignedInteger(&value, kuint64max));
        SET_FIELD(UInt64, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_FLOAT: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Float, io::SafeDoubleToFloat(value));
        break;
      }

      case FieldDescriptor::CPPTYPE_DOUBLE: {
        double value;
        DO(ConsumeDouble(&value));
        SET_FIELD(Double, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_STRING: {
        string value;
        DO(ConsumeString(&value));
        SET_FIELD(String, value);
        break;
      }

      case FieldDescriptor::CPPTYPE_BOOL: {
        if (LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          uint64 value;
          DO(ConsumeUnsignedInteger(&value, 1));
          SET_FIELD(Bool, value);
        } else {
          string value;
          DO(ConsumeIdentifier(&value));
          if (value == "true" || value == "True" || value == "t") {
            SET_FIELD(Bool, true);
          } else if (value == "false" || value == "False" || value == "f") {
            SET_FIELD(Bool, false);
          } else {
            ReportError("Invalid value for boolean field \"" + field->name()
                        + "\". Value: \"" + value  + "\".");
            return false;
          }
        }
        break;
      }

      case FieldDescriptor::CPPTYPE_ENUM: {
        string value;
        const EnumDescriptor* enum_type = field->enum_type();
        const EnumValueDescriptor* enum_value = NULL;

        if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
          DO(ConsumeIdentifier(&value));
          // Find the enumeration value.
          enum_value = enum_type->FindValueByName(value);

        } else if (LookingAt("-") ||
                   LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
          int64 int_value;
          DO(ConsumeSignedInteger(&int_value, kint32max));
          value = SimpleItoa(int_value);        // for error reporting
          enum_value = enum_type->FindValueByNumber(int_value);
        } else {
          ReportError("Expected integer or identifier, got: " +
                      tokenizer_.current().text);
          return false;
        }

        if (enum_value == NULL) {
          if (!allow_unknown_enum_) {
            ReportError("Unknown enumeration value of \"" + value  + "\" for "
                        "field \"" + field->name() + "\".");
            return false;
          } else {
            ReportWarning("Unknown enumeration value of \"" + value  + "\" for "
                          "field \"" + field->name() + "\".");
            return true;
          }
        }

        SET_FIELD(Enum, enum_value);
        break;
      }

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        // We should never get here. Put here instead of a default
        // so that if new types are added, we get a nice compiler warning.
        GOOGLE_LOG(FATAL) << "Reached an unintended state: CPPTYPE_MESSAGE";
        break;
      }
    }
#undef SET_FIELD
    return true;
  }